

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O1

char * flow::cstr(BinaryOperator op)

{
  if (op < (PInCidr|ISub)) {
    return &DAT_00183180 + *(int *)(&DAT_00183180 + (ulong)op * 4);
  }
  return "?";
}

Assistant:

const char* cstr(BinaryOperator op)  // {{{
{
  switch (op) {
    // numerical
    case BinaryOperator::IAdd: return"iadd";
    case BinaryOperator::ISub: return"isub";
    case BinaryOperator::IMul: return"imul";
    case BinaryOperator::IDiv: return"idiv";
    case BinaryOperator::IRem: return "irem";
    case BinaryOperator::IPow: return "ipow";
    case BinaryOperator::IAnd: return "iand";
    case BinaryOperator::IOr: return "ior";
    case BinaryOperator::IXor: return "ixor";
    case BinaryOperator::IShl: return "ishl";
    case BinaryOperator::IShr: return "ishr";
    case BinaryOperator::ICmpEQ: return "icmpeq";
    case BinaryOperator::ICmpNE: return "icmpne";
    case BinaryOperator::ICmpLE: return "icmple";
    case BinaryOperator::ICmpGE: return "icmpge";
    case BinaryOperator::ICmpLT: return "icmplt";
    case BinaryOperator::ICmpGT: return "icmpgt";
    // boolean
    case BinaryOperator::BAnd: return "band";
    case BinaryOperator::BOr: return "bor";
    case BinaryOperator::BXor: return "bxor";
    // string
    case BinaryOperator::SAdd: return "sadd";
    case BinaryOperator::SSubStr: return "ssubstr";
    case BinaryOperator::SCmpEQ: return "scmpeq";
    case BinaryOperator::SCmpNE: return "scmpne";
    case BinaryOperator::SCmpLE: return "scmple";
    case BinaryOperator::SCmpGE: return "scmpge";
    case BinaryOperator::SCmpLT: return "scmplt";
    case BinaryOperator::SCmpGT: return "scmpgt";
    case BinaryOperator::SCmpRE: return "scmpre";
    case BinaryOperator::SCmpBeg: return "scmpbeg";
    case BinaryOperator::SCmpEnd: return "scmpend";
    case BinaryOperator::SIn: return "sin";
    // ip
    case BinaryOperator::PCmpEQ: return "pcmpeq";
    case BinaryOperator::PCmpNE: return "pcmpne";
    case BinaryOperator::PInCidr: return "pincidr";
    default: return "?";
  };
}